

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUCS4Transcoder.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XMLUCS4Transcoder::transcodeFrom
          (XMLUCS4Transcoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  uint uVar1;
  bool bVar2;
  XMLCh *pXVar3;
  uint uVar4;
  uint *puVar5;
  
  pXVar3 = toFill;
  puVar5 = (uint *)srcData;
  do {
    if ((toFill + maxChars <= pXVar3) || (srcData + (srcCount & 0xfffffffffffffffc) <= puVar5))
    break;
    uVar1 = *puVar5;
    uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (this->fSwapped == false) {
      uVar4 = uVar1;
    }
    if (uVar4 < 0x10000) {
      *charSizes = '\x04';
      charSizes = charSizes + 1;
      *pXVar3 = (XMLCh)uVar4;
      pXVar3 = pXVar3 + 1;
LAB_00259702:
      puVar5 = puVar5 + 1;
      bVar2 = true;
    }
    else {
      if (pXVar3 + 1 != toFill + maxChars) {
        *charSizes = '\x04';
        *pXVar3 = (short)(uVar4 >> 10) + L'ퟀ';
        charSizes[1] = '\0';
        charSizes = charSizes + 2;
        pXVar3[1] = (XMLCh)uVar4 & 0x3ffU | 0xdc00;
        pXVar3 = pXVar3 + 2;
        goto LAB_00259702;
      }
      bVar2 = false;
    }
  } while (bVar2);
  *bytesEaten = (long)puVar5 - (long)srcData;
  return (long)pXVar3 - (long)toFill >> 1;
}

Assistant:

XMLSize_t
XMLUCS4Transcoder::transcodeFrom(const  XMLByte* const          srcData
                                , const XMLSize_t               srcCount
                                ,       XMLCh* const            toFill
                                , const XMLSize_t               maxChars
                                ,       XMLSize_t&              bytesEaten
                                ,       unsigned char* const    charSizes)
{
    //
    //  Get pointers to the start and end of the source buffer in terms of
    //  UCS-4 characters.
    //
    const UCS4Ch*   srcPtr = reinterpret_cast<const UCS4Ch*>(srcData);
    const UCS4Ch*   srcEnd = srcPtr + (srcCount / sizeof(UCS4Ch));

    //
    //  Get pointers to the start and end of the target buffer, which is
    //  in terms of the XMLCh chars we output.
    //
    XMLCh*  outPtr = toFill;
    XMLCh*  outEnd = toFill + maxChars;

    //
    //  And get a pointer into the char sizes buffer. We will run this
    //  up as we put chars into the output buffer.
    //
    unsigned char* sizePtr = charSizes;

    //
    //  Now process chars until we either use up all our source or all of
    //  our output space.
    //
    while ((outPtr < outEnd) && (srcPtr < srcEnd))
    {
        //
        //  Get the next UCS char out of the buffer. Don't bump the ptr
        //  yet since we might not have enough storage for it in the target
        //  (if its causes a surrogate pair to be created.
        //
        UCS4Ch nextVal = *srcPtr;

        // If it needs to be swapped, then do it
        if (fSwapped)
            nextVal = BitOps::swapBytes(nextVal);

        // Handle a surrogate pair if needed
        if (nextVal & 0xFFFF0000)
        {
            //
            //  If we don't have room for both of the chars, then we
            //  bail out now.
            //
            if (outPtr + 1 == outEnd)
                break;

            const XMLInt32 LEAD_OFFSET = 0xD800 - (0x10000 >> 10);
	        const XMLCh ch1 = XMLCh(LEAD_OFFSET + (nextVal >> 10));
	        const XMLCh ch2 = XMLCh(0xDC00 + (nextVal & 0x3FF));

            //
            //  We have room so store them both. But note that the
            //  second one took up no source bytes!
            //
            *sizePtr++ = sizeof(UCS4Ch);
            *outPtr++ = ch1;
            *sizePtr++ = 0;
            *outPtr++ = ch2;
        }
         else
        {
            //
            //  No surrogate, so just store it and bump the count of chars
            //  read. Update the char sizes buffer for this char's entry.
            //
            *sizePtr++ = sizeof(UCS4Ch);
            *outPtr++ = XMLCh(nextVal);
        }

        // Indicate that we ate another UCS char's worth of bytes
        srcPtr++;
    }

    // Set the bytes eaten parameter
    bytesEaten = ((const XMLByte*)srcPtr) - srcData;

    // And return the chars written into the output buffer
    return outPtr - toFill;
}